

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

void __thiscall
kratos::InterfaceVisitor::update_interface_definition
          (InterfaceVisitor *this,shared_ptr<kratos::IDefinition> *def,InterfaceRef *ref,
          Generator *gen)

{
  mutex *__mutex;
  long *plVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  shared_ptr<kratos::IDefinition> *psVar4;
  bool bVar5;
  int iVar6;
  iterator iVar7;
  _Base_ptr p_Var8;
  _Rb_tree_node_base *p_Var9;
  UserException *pUVar10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>_>_>
  *this_00;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  undefined1 local_198 [8];
  _Rb_tree_node_base local_190;
  size_t local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_148;
  undefined1 local_140 [8];
  undefined1 local_138 [32];
  size_t local_118;
  string local_110;
  string local_f0;
  string local_d0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>,_true>
  local_b0;
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Base_ptr local_88;
  size_t sStack_80;
  _Base_ptr local_78;
  size_t sStack_70;
  string local_60;
  Generator *local_40;
  shared_ptr<kratos::IDefinition> *local_38;
  
  __mutex = &this->lock_;
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  this_00 = &this->interfaces_;
  local_40 = gen;
  local_38 = def;
  (*((def->super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    _vptr_IDefinition[7])((key_type *)local_a8);
  iVar7 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_00->_M_h,(key_type *)local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._0_8_ != &local_98) {
    operator_delete((void *)local_a8._0_8_,local_98._M_allocated_capacity + 1);
  }
  if (iVar7.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    (*((local_38->super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      _vptr_IDefinition[7])(local_a8);
    local_198 = (undefined1  [8])local_40;
    local_190._0_8_ = ref;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<kratos::Generator*,kratos::InterfaceRef_const*>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<kratos::Generator*,kratos::InterfaceRef_const*>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::__cxx11::string,std::pair<kratos::Generator*,kratos::InterfaceRef_const*>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<kratos::Generator*,kratos::InterfaceRef_const*>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<kratos::Generator*,kratos::InterfaceRef_const*>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)this_00,local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._0_8_ != &local_98) {
      operator_delete((void *)local_a8._0_8_,local_98._M_allocated_capacity + 1);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  (*((local_38->super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    _vptr_IDefinition[7])((key_type *)local_a8);
  iVar7 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_00->_M_h,(key_type *)local_a8);
  if (iVar7.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._0_8_ != &local_98) {
    operator_delete((void *)local_a8._0_8_,local_98._M_allocated_capacity + 1);
  }
  psVar4 = local_38;
  plVar1 = (long *)**(undefined8 **)
                     ((long)iVar7.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>,_true>
                            ._M_cur + 0x30);
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (*(undefined8 **)
             ((long)iVar7.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>,_true>
                    ._M_cur + 0x30))[1];
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_b0 = iVar7.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>,_true>
             ._M_cur;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  local_148 = p_Var2;
  (*((psVar4->super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    _vptr_IDefinition[4])(local_198);
  (**(code **)(*plVar1 + 0x20))(local_a8,plVar1);
  if (sStack_80 == local_170) {
    bVar5 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::_Rb_tree_const_iterator<std::__cxx11::string>>
                      ((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )local_98._8_8_,(_Base_ptr)(local_a8 + 8),
                       (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )local_190._M_left);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a8);
    if (bVar5) {
      if (local_190._M_left != &local_190) {
        p_Var8 = local_190._M_left;
        do {
          peVar3 = (local_38->super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          (*peVar3->_vptr_IDefinition[2])
                    ((tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
                      *)local_a8,peVar3,p_Var8 + 1);
          (**(code **)(*plVar1 + 0x10))
                    ((tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
                      *)local_140,plVar1,p_Var8 + 1);
          bVar5 = true;
          if (local_88._0_4_ == local_138._24_4_) {
            bVar5 = std::
                    __tuple_compare<std::tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>,_std::tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>,_1UL,_4UL>
                    ::__eq((tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
                            *)local_a8,
                           (tuple<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
                            *)local_140);
            bVar5 = !bVar5;
          }
          if ((pointer)local_138._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_138._0_8_,local_138._16_8_ - local_138._0_8_);
          }
          if ((pointer)local_a8._8_8_ != (pointer)0x0) {
            operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
          }
          if (bVar5) {
            pUVar10 = (UserException *)__cxa_allocate_exception(0x10);
            Generator::handle_name_abi_cxx11_(&local_60,local_40);
            (*((local_38->super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->_vptr_IDefinition[7])(&local_110);
            Generator::handle_name_abi_cxx11_
                      (&local_f0,
                       *(Generator **)
                        ((long)&((local_b0._M_cur)->
                                super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>,_true>
                                ).
                                super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>_>
                                ._M_storage._M_storage + 0x20));
            (**(code **)(*plVar1 + 0x38))(&local_d0,plVar1);
            local_a8._8_8_ = local_60._M_string_length;
            local_98._M_allocated_capacity = (size_type)local_110._M_dataplus._M_p;
            local_98._8_8_ = local_110._M_string_length;
            local_88 = (_Base_ptr)local_f0._M_dataplus._M_p;
            sStack_80 = local_f0._M_string_length;
            local_78 = (_Base_ptr)local_d0._M_dataplus._M_p;
            sStack_70 = local_d0._M_string_length;
            format_str.size_ = 0xdddd;
            format_str.data_ = (char *)0x2a;
            args.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.args_ = in_R9.args_;
            args.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)local_a8;
            fmt::v7::detail::vformat_abi_cxx11_
                      ((string *)local_140,(detail *)"{0}.{1}\'s interface differs from {2}.{3}\'s",
                       format_str,args);
            UserException::UserException(pUVar10,(string *)local_140);
            __cxa_throw(pUVar10,&UserException::typeinfo,std::runtime_error::~runtime_error);
          }
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
        } while (p_Var8 != &local_190);
      }
      (*((local_38->super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        _vptr_IDefinition[5])(local_140);
      (**(code **)(*plVar1 + 0x28))(local_a8,plVar1);
      if (sStack_80 == local_118) {
        bVar5 = std::__equal<false>::
                equal<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::_Rb_tree_const_iterator<std::__cxx11::string>>
                          ((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )local_98._8_8_,(_Base_ptr)(local_a8 + 8),
                           (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )local_138._16_8_);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_a8);
        if (bVar5) {
          if ((_Rb_tree_node_base *)local_138._16_8_ != (_Rb_tree_node_base *)local_138) {
            p_Var9 = (_Rb_tree_node_base *)local_138._16_8_;
            do {
              peVar3 = (local_38->
                       super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              (*peVar3->_vptr_IDefinition[3])(local_a8,peVar3,p_Var9 + 1);
              (**(code **)(*plVar1 + 0x18))(&local_60,plVar1,p_Var9 + 1);
              bVar5 = true;
              if ((local_a8._0_4_ == local_60._M_dataplus._M_p._0_4_) &&
                 (local_98._M_allocated_capacity - local_a8._8_8_ ==
                  local_60.field_2._M_allocated_capacity - local_60._M_string_length)) {
                if (local_98._M_allocated_capacity == local_a8._8_8_) {
                  bVar5 = false;
                }
                else {
                  iVar6 = bcmp((void *)local_a8._8_8_,(void *)local_60._M_string_length,
                               local_98._M_allocated_capacity - local_a8._8_8_);
                  bVar5 = iVar6 != 0;
                }
              }
              if ((pointer)local_60._M_string_length != (pointer)0x0) {
                operator_delete((void *)local_60._M_string_length,
                                local_60.field_2._8_8_ - local_60._M_string_length);
              }
              if ((pointer)local_a8._8_8_ != (pointer)0x0) {
                operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
              }
              if (bVar5) {
                pUVar10 = (UserException *)__cxa_allocate_exception(0x10);
                Generator::handle_name_abi_cxx11_(&local_110,local_40);
                (*((local_38->super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->_vptr_IDefinition[7])(&local_f0);
                Generator::handle_name_abi_cxx11_
                          (&local_d0,
                           *(Generator **)
                            ((long)&((local_b0._M_cur)->
                                    super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>,_true>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>_>
                                    ._M_storage._M_storage + 0x20));
                (**(code **)(*plVar1 + 0x38))(&local_168,plVar1);
                local_a8._0_8_ = local_110._M_dataplus._M_p;
                local_a8._8_8_ = local_110._M_string_length;
                local_98._M_allocated_capacity = (size_type)local_f0._M_dataplus._M_p;
                local_98._8_8_ = local_f0._M_string_length;
                local_88 = (_Base_ptr)local_d0._M_dataplus._M_p;
                sStack_80 = local_d0._M_string_length;
                local_78 = (_Base_ptr)local_168;
                sStack_70 = uStack_160;
                format_str_00.size_ = 0xdddd;
                format_str_00.data_ = (char *)0x2a;
                args_00.
                super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                .field_1.args_ = in_R9.args_;
                args_00.
                super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                .desc_ = (unsigned_long_long)local_a8;
                fmt::v7::detail::vformat_abi_cxx11_
                          (&local_60,(detail *)"{0}.{1}\'s interface differs from {2}.{3}\'s",
                           format_str_00,args_00);
                UserException::UserException(pUVar10,&local_60);
                __cxa_throw(pUVar10,&UserException::typeinfo,std::runtime_error::~runtime_error);
              }
              p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
            } while (p_Var9 != (_Rb_tree_node_base *)local_138);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_140);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_198);
          if (local_148 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            return;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_148);
          return;
        }
      }
      else {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_a8);
      }
      pUVar10 = (UserException *)__cxa_allocate_exception(0x10);
      Generator::handle_name_abi_cxx11_(&local_110,local_40);
      (*((local_38->super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        _vptr_IDefinition[7])(&local_f0);
      Generator::handle_name_abi_cxx11_
                (&local_d0,
                 *(Generator **)
                  ((long)&((local_b0._M_cur)->
                          super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>,_true>
                          ).
                          super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>_>
                          ._M_storage._M_storage + 0x20));
      (**(code **)(*plVar1 + 0x38))(&local_168,plVar1);
      local_a8._0_8_ = local_110._M_dataplus._M_p;
      local_a8._8_8_ = local_110._M_string_length;
      local_98._M_allocated_capacity = (size_type)local_f0._M_dataplus._M_p;
      local_98._8_8_ = local_f0._M_string_length;
      local_88 = (_Base_ptr)local_d0._M_dataplus._M_p;
      sStack_80 = local_d0._M_string_length;
      local_78 = (_Base_ptr)local_168;
      sStack_70 = uStack_160;
      format_str_02.size_ = 0xdddd;
      format_str_02.data_ = (char *)0x2a;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_a8;
      fmt::v7::detail::vformat_abi_cxx11_
                (&local_60,(detail *)"{0}.{1}\'s interface differs from {2}.{3}\'s",format_str_02,
                 args_02);
      UserException::UserException(pUVar10,&local_60);
      __cxa_throw(pUVar10,&UserException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_a8);
  }
  pUVar10 = (UserException *)__cxa_allocate_exception(0x10);
  Generator::handle_name_abi_cxx11_(&local_60,local_40);
  (*((local_38->super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    _vptr_IDefinition[7])(&local_110);
  Generator::handle_name_abi_cxx11_
            (&local_f0,
             *(Generator **)
              ((long)&((local_b0._M_cur)->
                      super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>,_true>
                      ).
                      super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<kratos::Generator_*,_const_kratos::InterfaceRef_*>_>_>
                      ._M_storage._M_storage + 0x20));
  (**(code **)(*plVar1 + 0x38))(&local_d0,plVar1);
  local_a8._8_8_ = local_60._M_string_length;
  local_98._M_allocated_capacity = (size_type)local_110._M_dataplus._M_p;
  local_98._8_8_ = local_110._M_string_length;
  local_88 = (_Base_ptr)local_f0._M_dataplus._M_p;
  sStack_80 = local_f0._M_string_length;
  local_78 = (_Base_ptr)local_d0._M_dataplus._M_p;
  sStack_70 = local_d0._M_string_length;
  format_str_01.size_ = 0xdddd;
  format_str_01.data_ = (char *)0x2a;
  args_01.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args_01.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_a8;
  fmt::v7::detail::vformat_abi_cxx11_
            ((string *)local_140,(detail *)"{0}.{1}\'s interface differs from {2}.{3}\'s",
             format_str_01,args_01);
  UserException::UserException(pUVar10,(string *)local_140);
  __cxa_throw(pUVar10,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void update_interface_definition(const std::shared_ptr<IDefinition>& def,
                                     const InterfaceRef* ref, Generator* gen) {
        lock_.lock();
        if (interfaces_.find(def->def_name()) == interfaces_.end()) {
            interfaces_.emplace(def->def_name(), std::make_pair(gen, ref));
            lock_.unlock();
        } else {
            // making sure they are the same
            auto const& [reg_gen, ref_interface] = interfaces_.at(def->def_name());
            auto ref_def = ref_interface->definition();
            lock_.unlock();
            auto const& ports = def->ports();
            if (ref_def->ports() != ports)
                throw UserException(::format("{0}.{1}'s interface differs from {2}.{3}'s",
                                             gen->handle_name(), def->def_name(),
                                             reg_gen->handle_name(), ref_def->def_name()));
            for (auto const& port_name : ports) {
                if (def->port(port_name) != ref_def->port(port_name))
                    throw UserException(::format("{0}.{1}'s interface differs from {2}.{3}'s",
                                                 gen->handle_name(), def->def_name(),
                                                 reg_gen->handle_name(), ref_def->def_name()));
            }
            // same var as well
            auto const& vars = def->vars();
            if (ref_def->vars() != vars)
                throw UserException(::format("{0}.{1}'s interface differs from {2}.{3}'s",
                                             gen->handle_name(), def->def_name(),
                                             reg_gen->handle_name(), ref_def->def_name()));
            for (auto const& port_name : vars) {
                if (def->var(port_name) != ref_def->var(port_name))
                    throw UserException(::format("{0}.{1}'s interface differs from {2}.{3}'s",
                                                 gen->handle_name(), def->def_name(),
                                                 reg_gen->handle_name(), ref_def->def_name()));
            }
        }
    }